

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O1

short * __thiscall
SoundRenderer::DecodeSample
          (SoundRenderer *this,int outlen,void *coded,int sizebytes,ECodecType ctype)

{
  int iVar1;
  short *psVar2;
  undefined4 extraout_var;
  SampleType type;
  ChannelConfig chans;
  int srate;
  MemoryReader reader;
  int local_64;
  int local_60;
  undefined1 local_5c [4];
  MemoryReader local_58;
  long *plVar3;
  
  MemoryReader::MemoryReader(&local_58,(char *)coded,(long)sizebytes);
  psVar2 = (short *)calloc(1,(long)outlen);
  iVar1 = (*this->_vptr_SoundRenderer[0x21])(this,&local_58);
  plVar3 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar3 != (long *)0x0) {
    (**(code **)*plVar3)(plVar3,local_5c,&local_60,&local_64);
    if ((local_60 == 0) && (local_64 == 1)) {
      (**(code **)(*plVar3 + 8))(plVar3,psVar2,(long)outlen);
    }
    else {
      DPrintf(2,"Sample is not 16-bit mono\n");
    }
    (**(code **)(*plVar3 + 0x38))(plVar3);
  }
  MemoryReader::~MemoryReader(&local_58);
  return psVar2;
}

Assistant:

short *SoundRenderer::DecodeSample(int outlen, const void *coded, int sizebytes, ECodecType ctype)
{
    MemoryReader reader((const char*)coded, sizebytes);
    short *samples = (short*)calloc(1, outlen);
    ChannelConfig chans;
    SampleType type;
    int srate;

    SoundDecoder *decoder = CreateDecoder(&reader);
    if(!decoder) return samples;

    decoder->getInfo(&srate, &chans, &type);
    if(chans != ChannelConfig_Mono || type != SampleType_Int16)
    {
        DPrintf(DMSG_WARNING, "Sample is not 16-bit mono\n");
        delete decoder;
        return samples;
    }

    decoder->read((char*)samples, outlen);
    delete decoder;
    return samples;
}